

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

char * tar_i64toa(int64_t n0)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  
  uVar4 = -n0;
  if (0 < n0) {
    uVar4 = n0;
  }
  tar_i64toa::buff[0x17] = '\0';
  pbVar2 = (byte *)(tar_i64toa::buff + 0x16);
  do {
    pbVar3 = pbVar2;
    *pbVar3 = (byte)(uVar4 % 10) | 0x30;
    pbVar2 = pbVar3 + -1;
    bVar1 = 9 < uVar4;
    uVar4 = uVar4 / 10;
  } while (bVar1);
  if (n0 < 0) {
    *pbVar2 = 0x2d;
    pbVar3 = pbVar2;
  }
  return (char *)pbVar3;
}

Assistant:

const char *
tar_i64toa(int64_t n0)
{
	static char buff[24];
	uint64_t n = n0 < 0 ? -n0 : n0;
	char *p = buff + sizeof(buff);

	*--p = '\0';
	do {
		*--p = '0' + (int)(n % 10);
	} while (n /= 10);
	if (n0 < 0)
		*--p = '-';
	return p;
}